

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::conv3x3s1_winograd23_transform_kernel_int8_avx2
               (Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  void *pvVar7;
  size_t sVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  short *psVar14;
  uint uVar15;
  ulong uVar16;
  int kk;
  ulong uVar17;
  char *pcVar18;
  int m_1;
  long lVar19;
  uint max_ii;
  ulong uVar20;
  int _c;
  int TILE_M;
  int TILE_K;
  Mat m;
  int TILE_N;
  uint local_17c;
  ulong local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  ulong local_160;
  Mat local_158;
  short asStack_10c [2];
  Mat local_108;
  Mat local_b8;
  ulong local_70;
  Mat *local_68;
  short *local_60;
  long local_58;
  Mat *local_50;
  long local_48;
  ulong local_40;
  int local_34;
  
  local_68 = kernel;
  get_optimal_tile_mnk_int8(outch,0,inch,(int *)&local_17c,&local_34,&local_164,opt->num_threads);
  iVar13 = local_164;
  _c = (int)(outch + local_17c + -1) / (int)local_17c;
  iVar12 = local_17c * local_164;
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize._0_4_ = 0;
  local_158.elemsize._4_4_ = 0;
  local_158.elempack = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  local_70 = (ulong)(uint)outch;
  Mat::create(&local_158,iVar12 * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
  local_178 = (ulong)(uint)inch;
  local_50 = AT;
  Mat::create(AT,iVar12,0x10,(inch + -1 + iVar13) / iVar13,_c,2,(Allocator *)0x0);
  if (0 < _c) {
    local_168 = (int)local_178 * 9;
    local_58 = (long)(int)local_178;
    iVar13 = 0;
    local_170 = _c;
    do {
      local_160 = (ulong)(local_17c * iVar13);
      iVar12 = get_omp_thread_num();
      uVar11 = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      local_b8.data = (void *)((long)iVar12 * local_158.cstep * uVar11 + (long)local_158.data);
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = (undefined4)local_158.elemsize;
      local_b8.elemsize._4_4_ = local_158.elemsize._4_4_;
      local_b8.elempack = local_158.elempack;
      local_b8.allocator = local_158.allocator;
      local_b8.d = 1;
      local_b8.h = local_158.h;
      local_b8.c = local_158.d;
      local_b8.cstep =
           (uVar11 * (long)local_158.h * (long)local_158.w + 0xf & 0xfffffffffffffff0) / uVar11;
      local_b8.w = local_158.w;
      local_b8.dims = local_158.dims + -1;
      if (local_158.dims == 4) {
        local_b8.cstep = (long)local_158.h * (long)local_158.w;
      }
      local_16c = iVar13;
      if (0 < (int)local_178) {
        max_ii = (int)local_70 - (int)local_160;
        if ((int)local_17c < (int)max_ii) {
          max_ii = local_17c;
        }
        local_48 = (long)(int)((long)((ulong)(uint)((int)local_160 >> 0x1f) << 0x20 |
                                     local_160 & 0xffffffff) / (long)(int)local_17c);
        local_60 = (short *)local_b8.data;
        uVar20 = 0;
        local_40 = (long)local_164;
        uVar11 = (long)local_164;
        do {
          uVar10 = local_40;
          uVar15 = (int)local_178 - (int)uVar20;
          uVar16 = (ulong)uVar15;
          if ((int)uVar11 < (int)uVar15) {
            uVar16 = uVar11 & 0xffffffff;
          }
          if (0 < (int)max_ii) {
            pvVar7 = local_68->data;
            uVar11 = 0;
            psVar14 = local_60;
            do {
              if (0 < (int)uVar16) {
                uVar17 = 0;
                do {
                  pcVar18 = (char *)((long)pvVar7 +
                                    (uVar17 + uVar20) * 9 +
                                    (long)(((int)local_160 + (int)uVar11) * local_168));
                  lVar19 = 0;
                  do {
                    cVar1 = *pcVar18;
                    cVar2 = pcVar18[1];
                    cVar3 = pcVar18[2];
                    *(short *)((long)&local_108.data + lVar19 * 2) = cVar1 * 2;
                    *(short *)((long)&local_108.data + lVar19 * 2 + 6) =
                         (short)cVar2 + (short)cVar1 + (short)cVar3;
                    *(short *)((long)&local_108.refcount + lVar19 * 2 + 4) =
                         ((short)cVar1 - (short)cVar2) + (short)cVar3;
                    *(short *)((long)&local_108.elemsize + lVar19 * 2 + 2) =
                         (short)cVar3 + (short)cVar3;
                    pcVar18 = pcVar18 + 3;
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  lVar19 = 4;
                  do {
                    sVar4 = *(short *)((long)asStack_10c + lVar19);
                    sVar5 = *(short *)((long)asStack_10c + lVar19 + 2);
                    sVar6 = *(short *)((long)&local_108.data + lVar19);
                    *psVar14 = sVar4 * 2;
                    psVar14[1] = sVar5 + sVar4 + sVar6;
                    psVar14[2] = (sVar4 - sVar5) + sVar6;
                    psVar14[3] = sVar6 * 2;
                    psVar14 = psVar14 + 4;
                    lVar19 = lVar19 + 6;
                  } while (lVar19 != 0x1c);
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar16);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != max_ii);
          }
          sVar8 = local_50->elemsize;
          local_108.h = local_50->h;
          local_108.elempack = local_50->elempack;
          local_108.allocator = local_50->allocator;
          local_108.cstep = (long)local_108.h * (long)local_50->w;
          local_108.data =
               (void *)((long)local_50->data +
                       sVar8 * local_108.cstep *
                       (long)(int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 |
                                         uVar20 & 0xffffffff) / (long)(int)local_40) +
                       local_50->cstep * local_48 * sVar8);
          local_108.refcount._0_4_ = 0;
          local_108.refcount._4_4_ = 0;
          local_108.elemsize._0_4_ = (undefined4)sVar8;
          local_108.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
          local_108.w = local_50->w;
          local_108.dims = 2;
          local_108.d = 1;
          local_108.c = 1;
          pack_A_tile_int8(&local_b8,&local_108,0x10,max_ii,(int)uVar16);
          local_108.cstep = 0;
          local_108.data = (void *)0x0;
          local_108.refcount._0_4_ = 0;
          local_108.refcount._4_4_ = 0;
          local_108.elemsize._0_4_ = 0;
          local_108.elemsize._4_4_ = 0;
          local_108.elempack = 0;
          local_108.dims = 0;
          local_108.w = 0;
          local_108.h = 0;
          local_108.d = 0;
          local_108.c = 0;
          uVar20 = uVar20 + uVar10;
          uVar11 = uVar10;
        } while ((long)uVar20 < local_58);
      }
      iVar13 = local_16c;
      iVar12 = local_170;
      piVar9 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if ((short *)local_b8.data != (short *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      iVar13 = iVar13 + 1;
    } while (iVar13 != iVar12);
  }
  piVar9 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd23_transform_kernel_int8_avx2(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd23_transform_kernel_int8(kernel, AT, inch, outch, opt);
}